

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O1

void __thiscall Omega_h::Parents::~Parents(Parents *this)

{
  int *piVar1;
  Alloc *pAVar2;
  
  pAVar2 = (this->codes).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = (this->parent_idx).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      return;
    }
  }
  return;
}

Assistant:

OMEGA_H_INLINE Parents() {}